

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcess.c
# Opt level: O2

int runChild(char **cmd,int state,int exception,int value,int share,int output,int delay,
            double timeout,int poll,int repeat,int disown,int createNewGroup,uint interruptDelay)

{
  bool bVar1;
  FILE *pFVar2;
  int iVar3;
  uint uVar4;
  cmsysProcess *cp;
  char *pcVar5;
  double *userTimeout;
  uint uVar6;
  int length;
  uint local_5c;
  int local_58;
  int local_54;
  double local_50;
  char *data;
  char **local_40;
  double local_38;
  
  local_50 = timeout;
  local_40 = cmd;
  cp = cmsysProcess_New();
  if (cp == (cmsysProcess *)0x0) {
    fwrite("kwsysProcess_New returned NULL!\n",0x20,1,_stderr);
    iVar3 = 1;
  }
  else {
    iVar3 = 1;
    userTimeout = &local_38;
    if (poll == 0) {
      userTimeout = (double *)0x0;
    }
    local_5c = disown | share;
    local_58 = share;
    do {
      if (repeat < 1) goto LAB_001028fd;
      data = (char *)0x0;
      length = 0;
      local_38 = 0.0;
      local_54 = repeat;
      cmsysProcess_SetCommand(cp,local_40);
      if (0.0 <= local_50) {
        cmsysProcess_SetTimeout(cp,local_50);
      }
      if (local_58 != 0) {
        cmsysProcess_SetPipeShared(cp,2,1);
        cmsysProcess_SetPipeShared(cp,3,1);
      }
      if (disown != 0) {
        cmsysProcess_SetOption(cp,1,1);
      }
      if (createNewGroup != 0) {
        cmsysProcess_SetOption(cp,4,1);
      }
      cmsysProcess_Execute(cp);
      if (interruptDelay != 0) {
        sleep(interruptDelay);
        cmsysProcess_Interrupt(cp);
      }
      uVar6 = poll;
      if (local_5c == 0) {
LAB_00102642:
        iVar3 = cmsysProcess_WaitForData(cp,&data,&length,userTimeout);
        if (iVar3 != 0) {
          uVar4 = uVar6;
          if (output == 0) goto LAB_001026dd;
          if (iVar3 != 0xff || uVar6 == 0) {
            fwrite(data,1,(long)length,_stdout);
            fflush(_stdout);
            goto LAB_001026dd;
          }
          fwrite("WaitForData timeout reached.\n",0x1d,1,_stdout);
          fflush(_stdout);
          uVar4 = uVar6 + 1;
          if ((int)uVar6 < 0x13) goto LAB_001026dd;
          fprintf(_stdout,"Poll count reached limit %d.\n",0x14);
          cmsysProcess_Kill(cp);
          goto LAB_001026ec;
        }
      }
      if (disown == 0) {
        cmsysProcess_WaitForExit(cp,(double *)0x0);
      }
      else {
        cmsysProcess_Disown(cp);
      }
      iVar3 = cmsysProcess_GetState(cp);
      bVar1 = false;
      switch(iVar3) {
      case 0:
        pcVar5 = "No process has been executed.";
        break;
      case 1:
        pcVar5 = cmsysProcess_GetErrorString(cp);
        bVar1 = false;
        printf("Error in administrating child process: [%s]\n",pcVar5);
        goto switchD_00102729_default;
      case 2:
        pcVar5 = cmsysProcess_GetExceptionString(cp);
        printf("Subprocess terminated abnormally: %s\n",pcVar5);
        goto LAB_0010276a;
      case 3:
        pcVar5 = "The process is still executing.";
        break;
      case 4:
        uVar4 = cmsysProcess_GetExitValue(cp);
        printf("Subprocess exited with value = %d\n",(ulong)uVar4);
LAB_0010276a:
        iVar3 = cmsysProcess_GetExitException(cp);
        if ((iVar3 != exception) || (iVar3 = cmsysProcess_GetExitValue(cp), iVar3 != value)) {
          iVar3 = cmsysProcess_GetExitException(cp);
          pFVar2 = _stderr;
          if (iVar3 != exception) {
            uVar4 = cmsysProcess_GetExitException(cp);
            fprintf(pFVar2,"Mismatch in exit exception.  Should have been %d, was %d.\n",
                    (ulong)(uint)exception,(ulong)uVar4);
          }
          iVar3 = cmsysProcess_GetExitValue(cp);
          pFVar2 = _stderr;
          bVar1 = true;
          if (iVar3 != value) {
            uVar4 = cmsysProcess_GetExitValue(cp);
            fprintf(pFVar2,"Mismatch in exit value.  Should have been %d, was %d.\n",
                    (ulong)(uint)value,(ulong)uVar4);
            bVar1 = true;
          }
        }
        goto switchD_00102729_default;
      case 5:
        pcVar5 = "Subprocess was killed when timeout expired.";
        break;
      case 6:
        pcVar5 = "Subprocess was killed by parent.";
        break;
      case 7:
        pcVar5 = "Subprocess was disowned.";
        break;
      default:
        goto switchD_00102729_default;
      }
      puts(pcVar5);
switchD_00102729_default:
      iVar3 = cmsysProcess_GetState(cp);
      pFVar2 = _stderr;
      if (iVar3 != state) {
        uVar4 = cmsysProcess_GetState(cp);
        fprintf(pFVar2,"Mismatch in state.  Should have been %d, was %d.\n",(ulong)(uint)state,
                (ulong)uVar4);
        bVar1 = true;
      }
      if ((int)uVar6 < 5 && uVar6 != 0) {
        fprintf(_stderr,"Poll count is %d, which is less than %d.\n",(ulong)uVar6,5);
        break;
      }
      repeat = local_54 + -1;
      iVar3 = 0;
    } while (!bVar1);
    iVar3 = 1;
LAB_001028fd:
    cmsysProcess_Delete(cp);
  }
  return iVar3;
LAB_001026dd:
  uVar6 = 0;
  if (uVar4 != 0) {
LAB_001026ec:
    usleep(100000);
    uVar6 = uVar4;
  }
  goto LAB_00102642;
}

Assistant:

int runChild(const char* cmd[], int state, int exception, int value, int share,
             int output, int delay, double timeout, int poll, int repeat,
             int disown, int createNewGroup, unsigned int interruptDelay)
{
  int result = 1;
  kwsysProcess* kp = kwsysProcess_New();
  if (!kp) {
    fprintf(stderr, "kwsysProcess_New returned NULL!\n");
    return 1;
  }
  while (repeat-- > 0) {
    result = runChild2(kp, cmd, state, exception, value, share, output, delay,
                       timeout, poll, disown, createNewGroup, interruptDelay);
    if (result) {
      break;
    }
  }
  kwsysProcess_Delete(kp);
  return result;
}